

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O0

ImVec2 ImGui::GetMouseDragDelta(int button,float lock_threshold)

{
  bool local_21;
  ImGuiContext *g;
  float lock_threshold_local;
  int button_local;
  
  local_21 = 4 < (uint)button;
  if (local_21) {
    __assert_fail("button >= 0 && button < ((int)(sizeof(g.IO.MouseDown)/sizeof(*g.IO.MouseDown)))",
                  "/workspace/llm4binary/github/license_c_cmakelists/jdupuy[P]opengl-framework/submodules/imgui/imgui.cpp"
                  ,0x1291,"ImVec2 ImGui::GetMouseDragDelta(int, float)");
  }
  g._0_4_ = lock_threshold;
  if (lock_threshold < 0.0) {
    g._0_4_ = (GImGui->IO).MouseDragThreshold;
  }
  if ((((GImGui->IO).MouseDown[button] & 1U) == 0) ||
     ((GImGui->IO).MouseDragMaxDistanceSqr[button] < g._0_4_ * g._0_4_)) {
    ImVec2::ImVec2((ImVec2 *)&lock_threshold_local,0.0,0.0);
  }
  else {
    _lock_threshold_local =
         ::operator-(&(GImGui->IO).MousePos,(GImGui->IO).MouseClickedPos + button);
  }
  return _lock_threshold_local;
}

Assistant:

ImVec2 ImGui::GetMouseDragDelta(int button, float lock_threshold)
{
    ImGuiContext& g = *GImGui;
    IM_ASSERT(button >= 0 && button < IM_ARRAYSIZE(g.IO.MouseDown));
    if (lock_threshold < 0.0f)
        lock_threshold = g.IO.MouseDragThreshold;
    if (g.IO.MouseDown[button])
        if (g.IO.MouseDragMaxDistanceSqr[button] >= lock_threshold * lock_threshold)
            return g.IO.MousePos - g.IO.MouseClickedPos[button];     // Assume we can only get active with left-mouse button (at the moment).
    return ImVec2(0.0f, 0.0f);
}